

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.cpp
# Opt level: O3

int __thiscall de::Socket::listen(Socket *this,int __fd,int __n)

{
  deBool dVar1;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  dVar1 = deSocket_listen(this->m_socket,*(deSocketAddress **)CONCAT44(in_register_00000034,__fd));
  if (dVar1 != 0) {
    return dVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Listening on socket failed","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_00118c48;
  __cxa_throw(this_00,&SocketError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Socket::listen (const SocketAddress& address)
{
	if (!deSocket_listen(m_socket, address))
		throw SocketError("Listening on socket failed");
}